

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenlibClientSubscription.c
# Opt level: O3

int GenlibClientSubscription_assign(GenlibClientSubscription *p,GenlibClientSubscription *q)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  iVar3 = 1;
  if (p != q) {
    p->m_RenewEventId = q->m_RenewEventId;
    pcVar2 = UpnpString_get_String(q->m_SID);
    iVar1 = UpnpString_set_String(p->m_SID,pcVar2);
    iVar3 = 0;
    if (iVar1 != 0) {
      pcVar2 = UpnpString_get_String(q->m_ActualSID);
      iVar1 = UpnpString_set_String(p->m_ActualSID,pcVar2);
      iVar3 = 0;
      if (iVar1 != 0) {
        pcVar2 = UpnpString_get_String(q->m_EventURL);
        iVar1 = UpnpString_set_String(p->m_EventURL,pcVar2);
        if (iVar1 != 0) {
          p->m_Next = q->m_Next;
          iVar3 = 1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int GenlibClientSubscription_assign(
	GenlibClientSubscription *p, const GenlibClientSubscription *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     GenlibClientSubscription_set_RenewEventId(
			     p, GenlibClientSubscription_get_RenewEventId(q));
		ok = ok && GenlibClientSubscription_set_SID(
				   p, GenlibClientSubscription_get_SID(q));
		ok = ok && GenlibClientSubscription_set_ActualSID(p,
				   GenlibClientSubscription_get_ActualSID(q));
		ok = ok && GenlibClientSubscription_set_EventURL(
				   p, GenlibClientSubscription_get_EventURL(q));
		ok = ok && GenlibClientSubscription_set_Next(
				   p, GenlibClientSubscription_get_Next(q));
	}

	return ok;
}